

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::Test::RecordProperty(char *key,int value)

{
  char *value_00;
  ostream *this;
  Message value_message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char *local_28 [2];
  
  Message::Message((Message *)&local_30);
  this = (ostream *)(local_30.ptr_ + 0x10);
  if (local_30.ptr_ == (stringstream *)0x0) {
    this = (ostream *)0x0;
  }
  std::ostream::operator<<(this,value);
  internal::StringStreamToString((internal *)local_28,local_30.ptr_);
  value_00 = local_28[0];
  UnitTest::GetInstance();
  UnitTest::RecordPropertyForCurrentTest(&UnitTest::GetInstance::instance,key,value_00);
  if (local_28[0] != (char *)0x0) {
    operator_delete__(local_28[0]);
  }
  if (local_30.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_30.ptr_ + 8))();
  }
  return;
}

Assistant:

void Test::RecordProperty(const char* key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}